

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

string * __thiscall
cmTarget::GetFullNameImported
          (string *__return_storage_ptr__,cmTarget *this,string *config,bool implib)

{
  string local_30;
  
  ImportedGetFullPath(&local_30,this,config,implib);
  cmsys::SystemTools::GetFilenameName(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmTarget::GetFullNameImported(const std::string& config, bool implib) const
{
  return cmSystemTools::GetFilenameName(
    this->ImportedGetFullPath(config, implib));
}